

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(cmGeneratorExpressionDAGChecker *this)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = std::__cxx11::string::find((char *)&this->Property,0x46f160);
  if (lVar1 == 0) {
    bVar2 = true;
  }
  else {
    lVar1 = std::__cxx11::string::find((char *)&this->Property,0x46f167);
    bVar2 = lVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression()
{
  return this->Property.find("TARGET_GENEX_EVAL:") == 0 ||
    this->Property.find("GENEX_EVAL:", 0) == 0;
}